

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilBitMatrix.c
# Opt level: O0

int Extra_BitMatrixIsDisjoint(Extra_BitMat_t *p1,Extra_BitMat_t *p2)

{
  int local_28;
  int local_24;
  int w;
  int i;
  Extra_BitMat_t *p2_local;
  Extra_BitMat_t *p1_local;
  
  if (p1->nSize != p2->nSize) {
    __assert_fail("p1->nSize == p2->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/extra/extraUtilBitMatrix.c"
                  ,0x174,"int Extra_BitMatrixIsDisjoint(Extra_BitMat_t *, Extra_BitMat_t *)");
  }
  local_24 = 0;
  do {
    if (p1->nSize <= local_24) {
      return 1;
    }
    for (local_28 = 0; local_28 < p1->nWords; local_28 = local_28 + 1) {
      if ((p1->ppData[local_24][local_28] & p2->ppData[local_24][local_28]) != 0) {
        return 0;
      }
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

int Extra_BitMatrixIsDisjoint( Extra_BitMat_t * p1, Extra_BitMat_t * p2 )
{
    int i, w;
    assert( p1->nSize == p2->nSize );
    for ( i = 0; i < p1->nSize; i++ )
        for ( w = 0; w < p1->nWords; w++ )
            if ( p1->ppData[i][w] & p2->ppData[i][w] )
                return 0;
    return 1;
}